

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O3

void __thiscall
PSVIWriterHandlers::processDOMAttributes(PSVIWriterHandlers *this,DOMNamedNodeMap *attrs)

{
  short sVar1;
  short sVar2;
  bool bVar3;
  char cVar4;
  long lVar5;
  long *plVar6;
  short *psVar7;
  XMLCh *pXVar8;
  ulong uVar9;
  unsigned_long *puVar10;
  short *psVar11;
  ValueVectorOf<unsigned_long> *pVVar12;
  unsigned_long uVar13;
  XMLSize_t XVar14;
  
  this->fNSAttributes->fCurCount = 0;
  lVar5 = (**(code **)(*(long *)attrs + 0x28))(attrs);
  if (lVar5 != 0) {
    bVar3 = true;
    uVar13 = 0;
    do {
      plVar6 = (long *)(**(code **)(*(long *)attrs + 0x18))(attrs,uVar13);
      psVar7 = (short *)(**(code **)(*plVar6 + 0xb0))(plVar6);
      if (psVar7 == (short *)&xercesc_4_0::XMLUni::fgXMLNSURIName) {
LAB_00112643:
        pVVar12 = this->fNSAttributes;
        xercesc_4_0::ValueVectorOf<unsigned_long>::ensureExtraCapacity(pVVar12,1);
        XVar14 = pVVar12->fCurCount;
        pVVar12->fCurCount = XVar14 + 1;
        pVVar12->fElemList[XVar14] = uVar13;
      }
      else {
        psVar11 = (short *)&xercesc_4_0::XMLUni::fgXMLNSURIName;
        if (psVar7 == (short *)0x0) {
LAB_00112510:
          if (*psVar11 == 0) goto LAB_00112643;
        }
        else {
          psVar11 = (short *)&xercesc_4_0::XMLUni::fgXMLNSURIName;
          do {
            sVar1 = *psVar7;
            if (sVar1 == 0) goto LAB_00112510;
            psVar7 = psVar7 + 1;
            sVar2 = *psVar11;
            psVar11 = psVar11 + 1;
          } while (sVar1 == sVar2);
        }
        if (bVar3) {
          writeOpen(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributes);
          incIndent(this);
          bVar3 = false;
        }
        writeOpen(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttribute);
        incIndent(this);
        pXVar8 = (XMLCh *)(**(code **)(*plVar6 + 0xb0))(plVar6);
        sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNamespaceName,pXVar8);
        pXVar8 = (XMLCh *)(**(code **)(*plVar6 + 0xc0))(plVar6);
        sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgLocalName,pXVar8);
        pXVar8 = (XMLCh *)(**(code **)(*plVar6 + 0xb8))(plVar6);
        sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgPrefix,pXVar8);
        pXVar8 = (XMLCh *)(**(code **)(*plVar6 + 0x150))(plVar6);
        sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNormalizedValue,pXVar8);
        cVar4 = (**(code **)(*plVar6 + 0x148))(plVar6);
        pXVar8 = (XMLCh *)&xercesc_4_0::PSVIUni::fgFalse;
        if (cVar4 != '\0') {
          pXVar8 = (XMLCh *)&xercesc_4_0::PSVIUni::fgTrue;
        }
        sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSpecified,pXVar8);
        plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
        pXVar8 = (XMLCh *)(**(code **)(*plVar6 + 0x10))(plVar6);
        sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributeType,pXVar8);
        sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgReferences);
        sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttribute);
      }
      uVar13 = uVar13 + 1;
      uVar9 = (**(code **)(*(long *)attrs + 0x28))(attrs);
    } while (uVar13 < uVar9);
    if (!bVar3) {
      sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributes);
      goto LAB_001126a9;
    }
  }
  writeEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributes);
LAB_001126a9:
  if (this->fNSAttributes->fCurCount == 0) {
    writeEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNamespaceAttributes);
    return;
  }
  writeOpen(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNamespaceAttributes);
  incIndent(this);
  pVVar12 = this->fNSAttributes;
  if (pVVar12->fCurCount != 0) {
    XVar14 = 0;
    do {
      puVar10 = xercesc_4_0::ValueVectorOf<unsigned_long>::elementAt(pVVar12,XVar14);
      plVar6 = (long *)(**(code **)(*(long *)attrs + 0x18))(attrs,*puVar10);
      writeOpen(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttribute);
      incIndent(this);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNamespaceName,
                       (XMLCh *)&xercesc_4_0::XMLUni::fgXMLNSURIName);
      pXVar8 = (XMLCh *)(**(code **)(*plVar6 + 0xc0))(plVar6);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgLocalName,pXVar8);
      pXVar8 = (XMLCh *)(**(code **)(*plVar6 + 0xb8))(plVar6);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgPrefix,pXVar8);
      pXVar8 = (XMLCh *)(**(code **)(*plVar6 + 0x150))(plVar6);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNormalizedValue,pXVar8);
      cVar4 = (**(code **)(*plVar6 + 0x148))(plVar6);
      pXVar8 = (XMLCh *)&xercesc_4_0::PSVIUni::fgFalse;
      if (cVar4 != '\0') {
        pXVar8 = (XMLCh *)&xercesc_4_0::PSVIUni::fgTrue;
      }
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSpecified,pXVar8);
      plVar6 = (long *)(**(code **)(*plVar6 + 0x170))(plVar6);
      pXVar8 = (XMLCh *)(**(code **)(*plVar6 + 0x10))(plVar6);
      sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttributeType,pXVar8);
      sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgReferences);
      sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgAttribute);
      XVar14 = XVar14 + 1;
      pVVar12 = this->fNSAttributes;
    } while (XVar14 < pVVar12->fCurCount);
  }
  sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNamespaceAttributes);
  return;
}

Assistant:

void PSVIWriterHandlers::processDOMAttributes(DOMNamedNodeMap* attrs) {
	fNSAttributes->removeAllElements();
	bool firstFlag = true;
	for (XMLSize_t count=0; count < attrs->getLength(); count++) {
		DOMAttr* attr = (DOMAttr*)attrs->item(count);
        if (XMLString::equals(attr->getNamespaceURI(), XMLUni::fgXMLNSURIName)) {
			fNSAttributes->addElement(count);
		} else {
			if (firstFlag) {
				sendIndentedElement(PSVIUni::fgAttributes);
				firstFlag = false;
			}
			sendIndentedElement(PSVIUni::fgAttribute);
			sendElementValue(PSVIUni::fgNamespaceName, attr->getNamespaceURI());
			sendElementValue(PSVIUni::fgLocalName, attr->getLocalName());
			sendElementValue(PSVIUni::fgPrefix, attr->getPrefix());
			sendElementValue(PSVIUni::fgNormalizedValue, attr->getValue());
			sendElementValue(PSVIUni::fgSpecified, translateBool(attr->getSpecified()));
			sendElementValue(PSVIUni::fgAttributeType, attr->getSchemaTypeInfo()->getTypeName());
			sendElementEmpty(PSVIUni::fgReferences);
			sendUnindentedElement(PSVIUni::fgAttribute);
		}
	}
	if (firstFlag)
		writeEmpty(PSVIUni::fgAttributes);
	else
		sendUnindentedElement(PSVIUni::fgAttributes);

	//now for namespace attributes
	if (fNSAttributes->size()==0) {
		writeEmpty(PSVIUni::fgNamespaceAttributes);
	} else {
		sendIndentedElement(PSVIUni::fgNamespaceAttributes);
		for (XMLSize_t NScount = 0; NScount < fNSAttributes->size(); NScount++) {
			DOMAttr* attr = (DOMAttr*)attrs->item(fNSAttributes->elementAt(NScount));
			sendIndentedElement(PSVIUni::fgAttribute);
			sendElementValue(PSVIUni::fgNamespaceName, XMLUni::fgXMLNSURIName);
			sendElementValue(PSVIUni::fgLocalName, attr->getLocalName());
			sendElementValue(PSVIUni::fgPrefix, attr->getPrefix());
			sendElementValue(PSVIUni::fgNormalizedValue, attr->getValue());
			sendElementValue(PSVIUni::fgSpecified, translateBool(attr->getSpecified()));
			sendElementValue(PSVIUni::fgAttributeType, attr->getSchemaTypeInfo()->getTypeName());
			sendElementEmpty(PSVIUni::fgReferences);
			sendUnindentedElement(PSVIUni::fgAttribute);
		}
		sendUnindentedElement(PSVIUni::fgNamespaceAttributes);
	}
}